

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

lzham_decompress_state_ptr
lzham::lzham_lib_decompress_reinit(lzham_decompress_state_ptr p,lzham_decompress_params *pParams)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  void *pvVar5;
  lzham_decompress_state_ptr pvVar6;
  EVP_PKEY_CTX *ctx;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar10;
  
  if (p == (lzham_decompress_state_ptr)0x0) {
    pvVar6 = lzham_lib_decompress_init(pParams);
    return pvVar6;
  }
  bVar4 = check_params(pParams);
  if (bVar4) {
    if ((*(byte *)((long)p + 0x144) & 1) == 0) {
      lVar8 = 1L << (*(byte *)((long)p + 0x13c) & 0x3f);
      ctx = *(EVP_PKEY_CTX **)((long)p + 0xe8);
      uVar7 = (uint)lVar8;
      if ((ctx == (EVP_PKEY_CTX *)0x0) || (*(uint *)((long)p + 0xe0) < uVar7)) {
        pvVar5 = lzham_realloc(*p,ctx,lVar8 + 0xf,(size_t *)0x0,true);
        if (pvVar5 == (void *)0x0) {
          return (lzham_decompress_state_ptr)0x0;
        }
        *(void **)((long)p + 0xe8) = pvVar5;
        *(uint *)((long)p + 0xe0) = uVar7;
        *(ulong *)((long)p + 0xf0) = (long)pvVar5 + 0xfU & 0xfffffffffffffff0;
      }
    }
    else {
      ctx = *(EVP_PKEY_CTX **)((long)p + 0xe8);
      lzham_free(*p,ctx);
      *(undefined4 *)((long)p + 0xe0) = 0;
      *(undefined8 *)((long)p + 0xe8) = 0;
      *(undefined8 *)((long)p + 0xf0) = 0;
    }
    *(undefined8 *)((long)p + 0x158) = *(undefined8 *)&pParams->m_table_max_update_interval;
    uVar1 = *(undefined8 *)pParams;
    uVar2 = *(undefined8 *)&pParams->m_table_update_rate;
    pvVar5 = pParams->m_pSeed_bytes;
    *(undefined8 *)((long)p + 0x148) = *(undefined8 *)&pParams->m_num_seed_bytes;
    *(void **)((long)p + 0x150) = pvVar5;
    *(undefined8 *)((long)p + 0x138) = uVar1;
    *(undefined8 *)((long)p + 0x140) = uVar2;
    lzham_decompressor::init((lzham_decompressor *)p,ctx);
    auVar3 = _DAT_001170b0;
    lVar8 = 0x2f7;
    auVar9 = _DAT_00117090;
    auVar11 = _DAT_001170a0;
    do {
      auVar12 = auVar11 ^ auVar3;
      if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffff4) {
        *(undefined2 *)((long)p + lVar8 * 2 + -6) = 0x400;
        *(undefined2 *)((long)p + lVar8 * 2 + -4) = 0x400;
      }
      auVar12 = auVar9 ^ auVar3;
      if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffff4) {
        *(undefined2 *)((long)p + lVar8 * 2 + -2) = 0x400;
        *(undefined2 *)((long)p + lVar8 * 2) = 0x400;
      }
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x303);
    lVar8 = 0x300;
    do {
      *(undefined2 *)((long)p + lVar8 * 2) = 0x400;
      *(undefined2 *)((long)p + lVar8 * 2 + 0x18) = 0x400;
      *(undefined2 *)((long)p + lVar8 * 2 + 0x30) = 0x400;
      *(undefined2 *)((long)p + lVar8 * 2 + 0x48) = 0x400;
      *(undefined2 *)((long)p + lVar8 * 2 + 0x60) = 0x400;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x30c);
  }
  else {
    p = (lzham_decompress_state_ptr)0x0;
  }
  return p;
}

Assistant:

lzham_decompress_state_ptr LZHAM_CDECL lzham_lib_decompress_reinit(lzham_decompress_state_ptr p, const lzham_decompress_params *pParams)
   {
      if (!p)
         return lzham_lib_decompress_init(pParams);
      
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if (!check_params(pParams))
         return NULL;
      
      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         lzham_free(pState->m_malloc_context, pState->m_pRaw_decomp_buf);
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_raw_decomp_buf_size = 0;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         uint32 new_dict_size = 1U << pState->m_params.m_dict_size_log2;
         if ((!pState->m_pRaw_decomp_buf) || (pState->m_raw_decomp_buf_size < new_dict_size))
         {
            uint8 *pNew_dict = static_cast<uint8*>(lzham_realloc(pState->m_malloc_context, pState->m_pRaw_decomp_buf, new_dict_size + 15));
            if (!pNew_dict)
               return NULL;
            pState->m_pRaw_decomp_buf = pNew_dict;
            pState->m_raw_decomp_buf_size = new_dict_size;
            pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
         }
      }
      
      pState->m_params = *pParams;

      pState->init();

      pState->reset_arith_tables();
      return pState;
   }